

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::AppendUserMessage
                   (string *__return_storage_ptr__,string *gtest_msg,Message *user_msg)

{
  ulong uVar1;
  string *__lhs;
  string local_70 [16];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  undefined1 local_40 [8];
  string user_msg_string;
  Message *user_msg_local;
  string *gtest_msg_local;
  
  __lhs = __return_storage_ptr__;
  user_msg_string.field_2._8_8_ = user_msg;
  Message::GetString_abi_cxx11_((string *)local_40,user_msg);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::operator+(__lhs,__return_storage_ptr__);
    std::__cxx11::string::~string(local_70);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)gtest_msg);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __lhs;
}

Assistant:

std::string AppendUserMessage(const std::string& gtest_msg,
                              const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const std::string user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  return gtest_msg + "\n" + user_msg_string;
}